

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void color_tree_cleanup(ColorTree *tree)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    if (tree->children[lVar1] != (ColorTree *)0x0) {
      color_tree_cleanup(tree->children[lVar1]);
      free(tree->children[lVar1]);
    }
  }
  return;
}

Assistant:

static void color_tree_cleanup(ColorTree* tree)
{
  int i;
  for(i = 0; i != 16; ++i)
  {
    if(tree->children[i])
    {
      color_tree_cleanup(tree->children[i]);
      lodepng_free(tree->children[i]);
    }
  }
}